

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservableDictionaryExample.cpp
# Opt level: O1

void __thiscall DictListener::OnItemRemoved(DictListener *this,int *k,string *v)

{
  ostream *this_00;
  undefined1 local_1b0 [400];
  bool local_20;
  
  local_1b0._0_4_ = Info;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
  local_20 = false;
  this_00 = (ostream *)(local_1b0 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"DictListener::OnItemRemoved(",0x1c);
  std::ostream::operator<<(this_00,*k);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (this_00,(v->_M_dataplus)._M_p,v->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,")",1);
  Logger::LoggerWriter::~LoggerWriter((LoggerWriter *)local_1b0);
  return;
}

Assistant:

virtual void OnItemRemoved(const int& k, const std::string& v)
    {
        Logger::Log(LogLevel::Info) << "DictListener::OnItemRemoved(" << k << ", " << v << ")";
    }